

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int file_read(FILE *stream,void *buffer,size_t size)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  size_t size_local;
  void *buffer_local;
  FILE *stream_local;
  
  sVar3 = fread_unlocked(buffer,size,1,(FILE *)stream);
  if ((sVar3 == 1) || (size == 0)) {
    stream_local._4_4_ = 1;
  }
  else {
    iVar2 = feof_unlocked((FILE *)stream);
    __stream = _stderr;
    pcVar1 = argv0;
    if (iVar2 == 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"%s: failed reading %lu bytes: %s\n",pcVar1,size,pcVar5);
    }
    else {
      fprintf(_stderr,"%s: failed reading %lu bytes: unexpected end of file\n",argv0,size);
    }
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
file_read(
    FILE* stream,
    void* buffer,
    size_t size)
{
    if (fread_unlocked(buffer, size, 1, stream) != 1 && size != 0) {
        if (feof_unlocked(stream)) {
            fprintf(stderr,
                "%s: failed reading %lu bytes: unexpected end of file\n",
                argv0, (long unsigned int)size);
        } else {
            fprintf(stderr, "%s: failed reading %lu bytes: %s\n",
                argv0, (long unsigned int)size, strerror(errno));
        }
        return 0;
    } else
        return 1;
}